

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O2

void duckdb::MergeValidityInfo(UpdateInfo *current,ValidityMask *result_mask)

{
  uint uVar1;
  idx_t i;
  ulong uVar2;
  
  uVar1 = current->max;
  for (uVar2 = 0; uVar2 < current->N; uVar2 = uVar2 + 1) {
    TemplatedValidityMask<unsigned_long>::Set
              (&result_mask->super_TemplatedValidityMask<unsigned_long>,
               (ulong)*(uint *)((long)&current[1].segment + uVar2 * 4),
               *(bool *)((long)&current[1].segment + uVar2 + (ulong)uVar1 * 4));
  }
  return;
}

Assistant:

static void MergeValidityInfo(UpdateInfo &current, ValidityMask &result_mask) {
	auto tuples = current.GetTuples();
	auto info_data = current.GetData<bool>();
	for (idx_t i = 0; i < current.N; i++) {
		result_mask.Set(tuples[i], info_data[i]);
	}
}